

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<TraceEnum::EnumValue>::copyAppend
          (QGenericArrayOps<TraceEnum::EnumValue> *this,EnumValue *b,EnumValue *e)

{
  EnumValue *pEVar1;
  Data *pDVar2;
  int iVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    pEVar1 = (this->super_QArrayDataPointer<TraceEnum::EnumValue>).ptr;
    lVar4 = (this->super_QArrayDataPointer<TraceEnum::EnumValue>).size;
    do {
      pDVar2 = (b->name).d.d;
      pEVar1[lVar4].name.d.d = pDVar2;
      pEVar1[lVar4].name.d.ptr = (b->name).d.ptr;
      pEVar1[lVar4].name.d.size = (b->name).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      iVar3 = b->range;
      pEVar1[lVar4].value = b->value;
      pEVar1[lVar4].range = iVar3;
      b = b + 1;
      lVar4 = (this->super_QArrayDataPointer<TraceEnum::EnumValue>).size + 1;
      (this->super_QArrayDataPointer<TraceEnum::EnumValue>).size = lVar4;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }